

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_set_irreg_distr(Integer g_a,Integer *mapc,Integer *nblock)

{
  long lVar1;
  C_Integer *pCVar2;
  long icode;
  global_array_t *pgVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar5 = g_a + 1000;
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set irregular data distribution on array that has been allocated",0);
  }
  if (GA[lVar5].ndim < 1) {
    lVar6 = 0;
    pnga_error("Dimensions must be set before irregular distribution is specified",0);
    pgVar3 = GA;
    if (GA[lVar5].ndim < 1) goto LAB_00161fbf;
  }
  lVar6 = 0;
  pgVar3 = GA;
  do {
    if (pgVar3[g_a + 1000].dims[lVar6] < nblock[lVar6]) {
      pnga_error("number of blocks must be <= corresponding dimension",lVar6);
      pgVar3 = GA;
    }
    lVar6 = lVar6 + 1;
    lVar1 = (long)pgVar3[lVar5].ndim;
  } while (lVar6 < lVar1);
  if (0 < pgVar3[lVar5].ndim) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar1 = mapc[lVar6];
      if ((lVar1 < 1) || (pgVar3[lVar5].dims[lVar4] + 1 < lVar1)) {
        pnga_error("Mapc entry outside array dimension limits",lVar1);
      }
      if (nblock[lVar4] < 2) {
        lVar6 = lVar6 + 1;
      }
      else {
        lVar7 = 1;
        do {
          icode = mapc[lVar6 + lVar7];
          if (icode < lVar1) {
            pnga_error("Mapc entries are not properly monotonic",lVar1);
            icode = mapc[lVar6 + lVar7];
          }
          if ((icode < 1) || (GA[lVar5].dims[lVar4] + 1 < icode)) {
            pnga_error("Mapc entry outside array dimension limits",icode);
          }
          lVar7 = lVar7 + 1;
          lVar1 = icode;
        } while (lVar7 < nblock[lVar4]);
        lVar6 = lVar6 + lVar7;
      }
      lVar4 = lVar4 + 1;
      lVar1 = (long)GA[lVar5].ndim;
      pgVar3 = GA;
    } while (lVar4 < lVar1);
  }
  if (lVar1 < 1) {
    lVar6 = 0;
  }
  else {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar6 = lVar6 + nblock[lVar4];
      pgVar3[g_a + 1000].nblock[lVar4] = (int)nblock[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
LAB_00161fbf:
  pCVar2 = (C_Integer *)malloc(lVar6 * 8 + 8);
  pgVar3[lVar5].mapc = pCVar2;
  pgVar3 = GA;
  pCVar2 = GA[lVar5].mapc;
  if (0 < lVar6) {
    lVar1 = 0;
    do {
      pCVar2[lVar1] = mapc[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar6 != lVar1);
  }
  pCVar2[lVar6] = -1;
  pgVar3[lVar5].irreg = 1;
  return;
}

Assistant:

void pnga_set_irreg_distr(Integer g_a, Integer *mapc, Integer *nblock)
{
  Integer i, j, ichk, maplen;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set irregular data distribution on array that has been allocated",0);
  if (GA[ga_handle].ndim < 1)
    pnga_error("Dimensions must be set before irregular distribution is specified",0);
  for (i=0; i<GA[ga_handle].ndim; i++)
    if ((C_Integer)nblock[i] > GA[ga_handle].dims[i])
      pnga_error("number of blocks must be <= corresponding dimension",i);
  /* Check to see that mapc array is sensible */
  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    ichk = mapc[maplen];
    if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
      pnga_error("Mapc entry outside array dimension limits",ichk);
    maplen++;
    for (j=1; j<nblock[i]; j++) {
      if (mapc[maplen] < ichk) {
        pnga_error("Mapc entries are not properly monotonic",ichk);
      }
      ichk = mapc[maplen];
      if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
        pnga_error("Mapc entry outside array dimension limits",ichk);
      maplen++;
    }
  }

  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    maplen += nblock[i];
    GA[ga_handle].nblock[i] = (C_Integer)nblock[i];
  }
  GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
  for (i=0; i<maplen; i++) {
    GA[ga_handle].mapc[i] = (C_Integer)mapc[i];
  }
  GA[ga_handle].mapc[maplen] = -1;
  GA[ga_handle].irreg = 1;
}